

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeShape.cpp
# Opt level: O2

void __thiscall OpenMD::CompositeShape::~CompositeShape(CompositeShape *this)

{
  ~CompositeShape(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

CompositeShape::~CompositeShape() { Utils::deletePointers(shapes_); }